

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAllExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  undefined4 extraout_var_00;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  ulong uStack_c0;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  Bmc_EsPar_t local_88;
  uint local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 extraout_var;
  
  local_88.fVerbose = 0;
  local_88._52_4_ = 0;
  local_88.pTtStr = (char *)0x0;
  local_88.fOrderNodes = 0;
  local_88.fEnumSols = 0;
  local_88.fFewerVars = 0;
  local_88.RuntimeLim = 0;
  local_88.nVars = 0;
  local_88.nNodes = 0;
  local_88.nLutSize = 0;
  local_88.nMajSupp = 0;
  local_88.fMajority = 0;
  local_88.fUseIncr = 0;
  local_88.fOnlyAnd = 0;
  local_88.fGlucose = 0;
  local_a4 = 0;
  Extra_UtilGetoptReset();
  local_b0 = local_88.fEnumSols;
  local_b4 = local_88.fOrderNodes;
  local_ac = local_88.fOnlyAnd;
  local_a8 = local_88.fUseIncr;
  local_98 = 1;
  local_38 = 2;
  local_a0 = 0;
  local_90 = 0;
  local_94 = 0;
  local_8c = 0;
  local_44 = 0;
  local_9c = 0;
  local_40 = 0;
  uVar5 = local_88.nNodes;
LAB_002288d1:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"MINKiaoegvh");
    iVar4 = globalUtilOptind;
    switch(iVar1) {
    case 0x49:
      if (globalUtilOptind < argc) {
        iVar1 = atoi(argv[globalUtilOptind]);
        uVar2 = CONCAT44(extraout_var,iVar1);
        local_40 = uVar2;
        goto LAB_002289b2;
      }
      pcVar6 = "Command line switch \"-I\" should be followed by an integer.\n";
LAB_00228bf5:
      local_88.fEnumSols = local_b0;
      local_88.fOrderNodes = local_b4;
      local_88.fOnlyAnd = local_ac;
      local_88.fUseIncr = local_a8;
      local_88.nNodes = uVar5;
      Abc_Print(-1,pcVar6);
      goto LAB_00228bff;
    case 0x4a:
    case 0x4c:
      goto switchD_002288fc_caseD_62;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-K\" should be followed by an integer.\n";
        goto LAB_00228bf5;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      uVar2 = CONCAT44(extraout_var_00,iVar1);
      local_38 = uVar2;
LAB_002289b2:
      uVar8 = (uint)uVar2;
      break;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-M\" should be followed by an integer.\n";
        goto LAB_00228bf5;
      }
      local_9c = atoi(argv[globalUtilOptind]);
      uVar8 = local_9c;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_00228bf5;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_a4 = uVar5;
      uVar8 = uVar5;
      break;
    default:
      switch(iVar1) {
      case 0x61:
        local_ac = local_90 ^ 1;
        local_90 = local_ac;
        break;
      case 0x62:
      case 99:
      case 100:
      case 0x66:
      case 0x68:
        goto switchD_002288fc_caseD_62;
      case 0x65:
        local_b0 = local_8c ^ 1;
        local_8c = local_b0;
        break;
      case 0x67:
        local_44 = local_44 ^ 1;
        break;
      case 0x69:
        local_a8 = local_a0 ^ 1;
        local_a0 = local_a8;
        break;
      default:
        if (iVar1 == 0x6f) {
          local_b4 = local_94 ^ 1;
          local_94 = local_b4;
        }
        else {
          if (iVar1 != 0x76) {
            if (iVar1 == -1) {
              local_88.fEnumSols = local_b0;
              local_88.fOrderNodes = local_b4;
              local_88.fUseIncr = local_a8;
              local_88.fGlucose = local_44;
              local_88.fOnlyAnd = local_ac;
              local_88.fVerbose = local_98;
              uVar8 = (uint)local_38;
              uVar7 = (uint)local_40;
              local_88.nNodes = uVar5;
              local_88.nVars = uVar7;
              local_88.nMajSupp = local_9c;
              local_88.nLutSize = uVar8;
              if (local_9c == 0) {
                if (uVar7 == 0) {
                  pcVar6 = 
                  "The number of variables (-I num) needs to be specified on the command line.\n";
                }
                else if (local_a4 == 0) {
                  pcVar6 = 
                  "The number of nodes (-N num) needs to be specified on the command line.\n";
                }
                else {
                  if ((globalUtilOptind + 1 == argc) &&
                     (local_88.pTtStr = argv[globalUtilOptind], local_88.pTtStr != (char *)0x0)) {
                    uVar5 = 1 << ((char)local_40 - 2U & 0x1f);
                    sVar3 = strlen(local_88.pTtStr);
                    uStack_c0 = (ulong)local_a4;
                    if (uVar5 != (uint)sVar3) {
                      Abc_Print(-1,
                                "Truth table is expected to have %d hex digits (instead of %d).\n",
                                (ulong)uVar5,sVar3);
                      return 1;
                    }
                    goto LAB_00228dd4;
                  }
                  pcVar6 = "Truth table should be given on the command line.\n";
                }
              }
              else if ((local_9c < 10) && ((0x2a0U >> (local_9c & 0x1f) & 1) != 0)) {
                local_88.nVars = local_9c;
                local_88.nLutSize = 3;
                local_88.fMajority = 1;
                local_88.fUseIncr = 1;
                uVar8 = 3;
                local_a0 = 1;
                uStack_c0 = (ulong)local_a4;
                uVar7 = local_9c;
                if (local_a4 == 0) {
                  if (local_9c == 5) {
                    uStack_c0 = 4;
                  }
                  else if (local_9c == 9) {
                    uStack_c0 = 10;
                  }
                  else {
                    uStack_c0 = 0;
                    if (local_9c != 7) goto LAB_00228dd4;
                    uStack_c0 = 7;
                  }
                  local_88.nNodes = (int)uStack_c0;
                }
LAB_00228dd4:
                if ((int)((uVar8 - 1) * (int)uStack_c0 + 1) < (int)uVar7) {
                  Abc_Print(-1,
                            "Function with %d variales cannot be implemented with %d %d-input LUTs.\n"
                            ,(ulong)uVar7,uStack_c0,(ulong)uVar8);
                  return 1;
                }
                if ((int)uVar7 < 0xb) {
                  if ((int)uVar8 < 7) {
                    if (local_a0 != 0) {
LAB_00228e26:
                      Zyx_ManExactSynthesis(&local_88);
                      return 0;
                    }
                    if (local_9c == 0) {
                      if ((int)uVar8 < 4) goto LAB_00228e26;
                      pcVar6 = 
                      "Cannot synthesize LUT4 and larger in non-incremental mode (use \'-i\').\n";
                    }
                    else {
                      pcVar6 = 
                      "Cannot synthesize majority in the non-incremental mode (use \'-i\').\n";
                    }
                  }
                  else {
                    pcVar6 = "Node size should not be more than 6 inputs.\n";
                  }
                }
                else {
                  pcVar6 = "Function should not have more than 10 inputs.\n";
                }
              }
              else {
                pcVar6 = "Currently only support majority with 5, 7 or 9 inputs.\n";
              }
              iVar4 = -1;
              goto LAB_00228d2a;
            }
            goto switchD_002288fc_caseD_62;
          }
          local_98 = local_98 ^ 1;
        }
      }
      goto LAB_002288d1;
    }
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar8 < 0) {
switchD_002288fc_caseD_62:
      local_88.fEnumSols = local_b0;
      local_88.fOrderNodes = local_b4;
      local_88.fOnlyAnd = local_ac;
      local_88.fUseIncr = local_a8;
      local_88.nNodes = uVar5;
LAB_00228bff:
      iVar4 = -2;
      Abc_Print(-2,"usage: allexact [-MIKN <num>] [-iaoevh] <hex>\n");
      Abc_Print(-2,"\t           exact synthesis of I-input function using N K-input gates\n");
      Abc_Print(-2,"\t-M <num> : the majority support size (overrides -I and -K) [default = %d]\n",
                (ulong)local_9c);
      Abc_Print(-2,"\t-I <num> : the number of input variables [default = %d]\n",local_40);
      Abc_Print(-2,"\t-K <num> : the number of node fanins [default = %d]\n",local_38);
      Abc_Print(-2,"\t-N <num> : the number of K-input nodes [default = %d]\n",(ulong)local_a4);
      pcVar9 = "yes";
      pcVar6 = "yes";
      if (local_a0 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-i       : toggle using incremental solving [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_90 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-a       : toggle using only AND-gates when K = 2 [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_94 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-o       : toggle using node ordering by fanins [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_8c == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-e       : toggle enumerating all solutions [default = %s]\n",pcVar6);
      if (local_98 == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar9);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      pcVar6 = "\t<hex>    : truth table in hex notation\n";
LAB_00228d2a:
      Abc_Print(iVar4,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAllExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Zyx_ManExactSynthesis( Bmc_EsPar_t * pPars );
    int c;
    Bmc_EsPar_t Pars, * pPars = &Pars;
    Bmc_EsParSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MINKiaoegvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMajSupp = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMajSupp < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVars < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNodes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNodes < 0 )
                goto usage;
            break;
       case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 0 )
                goto usage;
            break;
        case 'i':
            pPars->fUseIncr ^= 1;
            break;
        case 'a':
            pPars->fOnlyAnd ^= 1;
            break;
        case 'o':
            pPars->fOrderNodes ^= 1;
            break;
        case 'e':
            pPars->fEnumSols ^= 1;
            break;
        case 'g':
            pPars->fGlucose ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pPars->nMajSupp > 0 )
    {
        if ( pPars->nMajSupp != 5 && pPars->nMajSupp != 7 && pPars->nMajSupp != 9 )
        {
            Abc_Print( -1, "Currently only support majority with 5, 7 or 9 inputs.\n" );
            return 1;
        }
        pPars->nVars = pPars->nMajSupp;
        pPars->nLutSize = 3;
        pPars->fMajority = 1;
        pPars->fUseIncr = 1;
        if ( pPars->nNodes == 0 )
        {
            if ( pPars->nMajSupp == 5 )
                pPars->nNodes = 4;
            if ( pPars->nMajSupp == 7 )
                pPars->nNodes = 7;
            if ( pPars->nMajSupp == 9 )
                pPars->nNodes = 10;
        }
    }
    else
    {
        if ( pPars->nVars == 0 )
        {
            Abc_Print( -1, "The number of variables (-I num) needs to be specified on the command line.\n" );
            return 1;
        }
        if ( pPars->nNodes == 0 )
        {
            Abc_Print( -1, "The number of nodes (-N num) needs to be specified on the command line.\n" );
            return 1;
        }
        if ( argc == globalUtilOptind + 1 )
            pPars->pTtStr = argv[globalUtilOptind];
        if ( pPars->pTtStr == NULL )
        {
            Abc_Print( -1, "Truth table should be given on the command line.\n" );
            return 1;
        }
        if ( (1 << (pPars->nVars-2)) != (int)strlen(pPars->pTtStr) )
        {
            Abc_Print( -1, "Truth table is expected to have %d hex digits (instead of %d).\n", (1 << (pPars->nVars-2)), strlen(pPars->pTtStr) );
            return 1;
        }
    }
    if ( pPars->nVars > pPars->nNodes * (pPars->nLutSize - 1) + 1 )
    {
        Abc_Print( -1, "Function with %d variales cannot be implemented with %d %d-input LUTs.\n", pPars->nVars, pPars->nNodes, pPars->nLutSize );
        return 1;
    }
    if ( pPars->nVars > 10 )
    {
        Abc_Print( -1, "Function should not have more than 10 inputs.\n" );
        return 1;
    }
    if ( pPars->nLutSize > 6 )
    {
        Abc_Print( -1, "Node size should not be more than 6 inputs.\n" );
        return 1;
    }
    if ( !pPars->fUseIncr )
    {
        if ( pPars->fMajority )
        {
            Abc_Print( -1, "Cannot synthesize majority in the non-incremental mode (use \'-i\').\n" );
            return 1;
        }
        if ( pPars->nLutSize > 3 )
        {
            Abc_Print( -1, "Cannot synthesize LUT4 and larger in non-incremental mode (use \'-i\').\n" );
            return 1;
        }
    }
    Zyx_ManExactSynthesis( pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: allexact [-MIKN <num>] [-iaoevh] <hex>\n" );
    Abc_Print( -2, "\t           exact synthesis of I-input function using N K-input gates\n" );
    Abc_Print( -2, "\t-M <num> : the majority support size (overrides -I and -K) [default = %d]\n", pPars->nMajSupp );
    Abc_Print( -2, "\t-I <num> : the number of input variables [default = %d]\n", pPars->nVars );
    Abc_Print( -2, "\t-K <num> : the number of node fanins [default = %d]\n", pPars->nLutSize );
    Abc_Print( -2, "\t-N <num> : the number of K-input nodes [default = %d]\n", pPars->nNodes );
    Abc_Print( -2, "\t-i       : toggle using incremental solving [default = %s]\n", pPars->fUseIncr ? "yes" : "no" );
    Abc_Print( -2, "\t-a       : toggle using only AND-gates when K = 2 [default = %s]\n", pPars->fOnlyAnd ? "yes" : "no" );
    Abc_Print( -2, "\t-o       : toggle using node ordering by fanins [default = %s]\n", pPars->fOrderNodes ? "yes" : "no" );
    Abc_Print( -2, "\t-e       : toggle enumerating all solutions [default = %s]\n", pPars->fEnumSols ? "yes" : "no" );
//    Abc_Print( -2, "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", pPars->fGlucose ? "yes" : "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", pPars->fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n" );
    Abc_Print( -2, "\t<hex>    : truth table in hex notation\n" );
    return 1;
}